

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20poly1305.cpp
# Opt level: O0

void __thiscall
AEADChaCha20Poly1305::Encrypt
          (AEADChaCha20Poly1305 *this,Span<const_std::byte> plain1,Span<const_std::byte> plain2,
          Span<const_std::byte> aad,Nonce96 nonce,Span<std::byte> cipher)

{
  Nonce96 nonce_00;
  Nonce96 nonce_01;
  Span<std::byte> output;
  Span<std::byte> output_00;
  Span<const_std::byte> input;
  Span<const_std::byte> input_00;
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  byte *in_RDX;
  size_t in_RSI;
  ChaCha20 *in_RDI;
  byte *in_R8;
  long in_FS_OFFSET;
  size_t in_stack_00000018;
  undefined1 in_stack_00000020 [16];
  Span<const_std::byte> in_stack_00000030;
  Span<const_std::byte> *in_stack_fffffffffffffed8;
  size_t in_stack_fffffffffffffee0;
  ChaCha20 *in_stack_fffffffffffffee8;
  ChaCha20 *this_00;
  undefined8 *puVar4;
  ChaCha20 *pCVar5;
  byte *in_stack_ffffffffffffffb0;
  undefined1 local_18 [16];
  long local_8;
  
  puVar4 = (undefined8 *)&stack0x00000008;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar5 = in_RDI;
  local_18._0_8_ = in_RSI;
  local_18._8_8_ = in_RDX;
  sVar1 = Span<std::byte>::size((Span<std::byte> *)in_stack_fffffffffffffed8);
  sVar2 = Span<const_std::byte>::size(in_stack_fffffffffffffed8);
  sVar3 = Span<const_std::byte>::size(in_stack_fffffffffffffed8);
  if (sVar1 != sVar2 + sVar3 + 0x10) {
    __assert_fail("cipher.size() == plain1.size() + plain2.size() + EXPANSION",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/crypto/chacha20poly1305.cpp"
                  ,0x47,
                  "void AEADChaCha20Poly1305::Encrypt(Span<const std::byte>, Span<const std::byte>, Span<const std::byte>, Nonce96, Span<std::byte>)"
                 );
  }
  nonce_00.second = (unsigned_long)in_RDI;
  nonce_00._0_8_ = puVar4;
  ChaCha20::Seek(in_stack_fffffffffffffee8,nonce_00,(uint32_t)(in_stack_fffffffffffffee0 >> 0x20));
  this_00 = (ChaCha20 *)local_18;
  Span<const_std::byte>::size(in_stack_fffffffffffffed8);
  Span<std::byte>::first((Span<std::byte> *)this_00,in_stack_fffffffffffffee0);
  input.m_size = in_stack_00000018;
  input.m_data = (byte *)local_18._8_8_;
  output.m_size = local_18._0_8_;
  output.m_data = in_stack_ffffffffffffffb0;
  ChaCha20::Crypt(pCVar5,input,output);
  Span<const_std::byte>::size(in_stack_fffffffffffffed8);
  Span<std::byte>::subspan((Span<std::byte> *)this_00,in_stack_fffffffffffffee0);
  Span<const_std::byte>::size(in_stack_fffffffffffffed8);
  Span<std::byte>::first((Span<std::byte> *)this_00,in_stack_fffffffffffffee0);
  input_00.m_size = in_stack_00000018;
  input_00.m_data = (byte *)local_18._8_8_;
  output_00.m_size = local_18._0_8_;
  output_00.m_data = in_R8;
  ChaCha20::Crypt(pCVar5,input_00,output_00);
  nonce_01.second = (unsigned_long)in_RDI;
  nonce_01._0_8_ = puVar4;
  ChaCha20::Seek(this_00,nonce_01,(uint32_t)(in_stack_fffffffffffffee0 >> 0x20));
  pCVar5 = (ChaCha20 *)*puVar4;
  Span<std::byte>::size((Span<std::byte> *)in_stack_fffffffffffffed8);
  Span<std::byte>::first((Span<std::byte> *)this_00,in_stack_fffffffffffffee0);
  Span<const_std::byte>::Span<std::byte,_0>(in_stack_fffffffffffffed8,(Span<std::byte> *)0x1b38e10);
  Span<std::byte>::last((Span<std::byte> *)this_00,in_stack_fffffffffffffee0);
  anon_unknown.dwarf_35d2d8b::ComputeTag
            (pCVar5,in_stack_00000030,(Span<const_std::byte>)in_stack_00000020,
             (Span<std::byte>)plain2);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void AEADChaCha20Poly1305::Encrypt(Span<const std::byte> plain1, Span<const std::byte> plain2, Span<const std::byte> aad, Nonce96 nonce, Span<std::byte> cipher) noexcept
{
    assert(cipher.size() == plain1.size() + plain2.size() + EXPANSION);

    // Encrypt using ChaCha20 (starting at block 1).
    m_chacha20.Seek(nonce, 1);
    m_chacha20.Crypt(plain1, cipher.first(plain1.size()));
    m_chacha20.Crypt(plain2, cipher.subspan(plain1.size()).first(plain2.size()));

    // Seek to block 0, and compute tag using key drawn from there.
    m_chacha20.Seek(nonce, 0);
    ComputeTag(m_chacha20, aad, cipher.first(cipher.size() - EXPANSION), cipher.last(EXPANSION));
}